

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventLoopGroup.cpp
# Opt level: O3

void __thiscall Liby::EventLoopGroup::run(EventLoopGroup *this,BoolFunctor *bf)

{
  allocator_type *__args_1;
  allocator_type *paVar1;
  allocator_type *paVar2;
  size_type __n;
  allocator_type *paVar3;
  allocator_type *paVar4;
  thread in_RCX;
  thread *__cur;
  allocator_type *paVar5;
  allocator_type *__a;
  uint uVar6;
  anon_class_8_1_8991fb9c_for__M_head_impl *__args;
  undefined8 local_58;
  undefined8 uStack_50;
  code *local_48;
  code *local_40;
  
  local_58 = 0;
  uStack_50 = 0;
  local_40 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:26:29)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/EventLoopGroup.cpp:26:29)>
             ::_M_manager;
  Signal::signal(0xd,(__sighandler_t)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,3);
  }
  std::function<bool_()>::operator=(&this->bf_,bf);
  if (0 < this->n_) {
    __a = (allocator_type *)
          (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish;
    __args = (anon_class_8_1_8991fb9c_for__M_head_impl *)0x0;
    do {
      uVar6 = (int)__args + 1;
      __args = (anon_class_8_1_8991fb9c_for__M_head_impl *)(ulong)uVar6;
      if (__a == (allocator_type *)
                 (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage) {
        __n = std::vector<std::thread,_std::allocator<std::thread>_>::_M_check_len
                        (&this->threads_,1,"vector::_M_realloc_insert");
        __args_1 = (allocator_type *)
                   (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        paVar1 = (allocator_type *)
                 (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        if (__n == 0) {
          paVar3 = (allocator_type *)0x0;
        }
        else {
          paVar3 = (allocator_type *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)&this->threads_,__n,(void *)0x0);
        }
        in_RCX._M_id._M_thread = (id)(id)__args_1;
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,Liby::EventLoopGroup::run(std::function<bool()>)::__1,int>
                  (paVar3 + ((long)__a - (long)__args_1 >> 3) * 8,(thread *)this,__args,
                   (int *)__args_1);
        paVar5 = paVar3;
        for (paVar4 = __args_1; paVar2 = __a, paVar4 != __a; paVar4 = paVar4 + 8) {
          in_RCX._M_id._M_thread = *(id *)paVar4;
          *(id *)paVar5 = in_RCX._M_id._M_thread;
          *(id *)paVar4 = (id)0x0;
          paVar5 = paVar5 + 8;
        }
        for (; __a = paVar5 + 8, paVar1 != paVar2; paVar2 = paVar2 + 8) {
          *(native_handle_type *)__a = (native_handle_type)*(id *)paVar2;
          *(id *)paVar2 = (id)0x0;
          paVar5 = __a;
        }
        if (__args_1 != (allocator_type *)0x0) {
          operator_delete(__args_1);
        }
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)paVar3;
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)__a;
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)(paVar3 + __n * 8);
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,Liby::EventLoopGroup::run(std::function<bool()>)::__1,int>
                  (__a,(thread *)this,__args,(int *)in_RCX._M_id._M_thread);
        __a = (allocator_type *)
              ((this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
               _M_impl.super__Vector_impl_data._M_finish + 1);
        (this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)__a;
      }
    } while ((int)uVar6 < this->n_);
  }
  worker_thread(this,0);
  return;
}

Assistant:

void EventLoopGroup::run(BoolFunctor bf) {
    Signal::signal(SIGPIPE, [] { error("receive SIGPIPE"); });

    bf_ = bf;
    for (int i = 0; i < n_; i++) {
        threads_.emplace_back([this](int index) { worker_thread(index); },
                              i + 1);
    }

    worker_thread(0);
}